

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderMoveToElement(xmlTextReaderPtr reader)

{
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node->type == XML_ELEMENT_NODE) {
    if (reader->curnode == (xmlNodePtr)0x0) {
      reader_local._4_4_ = 0;
    }
    else {
      reader->curnode = (xmlNodePtr)0x0;
      reader_local._4_4_ = 1;
    }
  }
  else {
    reader_local._4_4_ = 0;
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderMoveToElement(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(-1);
    if (reader->node->type != XML_ELEMENT_NODE)
	return(0);
    if (reader->curnode != NULL) {
	reader->curnode = NULL;
	return(1);
    }
    return(0);
}